

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O2

shared_ptr<ApprovalTests::ApprovalNamer> __thiscall ApprovalTests::Options::getNamer(Options *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<ApprovalTests::ApprovalNamer> sVar1;
  
  ::std::__shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2> *)
             (in_RSI + 0x50));
  sVar1.super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<ApprovalTests::ApprovalNamer>)
         sVar1.super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ApprovalNamer> Options::getNamer() const
    {
        return namer_;
    }